

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::TestBody
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  uint32_t uVar7;
  char *pcVar8;
  Address *address;
  size_type sVar9;
  undefined1 uVar10;
  char *in_R9;
  Amount AVar11;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  uint32_t index;
  AssertionResult gtest_ar_2;
  Address out1_addr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  OutPoint outpoint;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  ConfidentialTransactionContext txc;
  bool *in_stack_fffffffffffff228;
  undefined7 in_stack_fffffffffffff230;
  undefined1 in_stack_fffffffffffff237;
  unsigned_long *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff247;
  char *in_stack_fffffffffffff248;
  OutPoint *in_stack_fffffffffffff268;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  Address *in_stack_fffffffffffff278;
  allocator *paVar12;
  undefined7 in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff287;
  uint32_t *in_stack_fffffffffffff288;
  OutPoint *in_stack_fffffffffffff290;
  undefined7 in_stack_fffffffffffff298;
  undefined1 in_stack_fffffffffffff29f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff2a0;
  undefined7 in_stack_fffffffffffff2a8;
  undefined1 in_stack_fffffffffffff2af;
  Address *in_stack_fffffffffffff2b0;
  undefined7 in_stack_fffffffffffff2b8;
  undefined1 in_stack_fffffffffffff2bf;
  Script *in_stack_fffffffffffff2c0;
  ConfidentialTransactionContext *in_stack_fffffffffffff2c8;
  ConfidentialAssetId *in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2e0;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffff2f8;
  NetType in_stack_fffffffffffff300;
  uint32_t in_stack_fffffffffffff304;
  undefined1 remove_nonce;
  ConfidentialTransactionContext *in_stack_fffffffffffff308;
  undefined5 in_stack_fffffffffffff310;
  undefined1 in_stack_fffffffffffff315;
  undefined1 in_stack_fffffffffffff316;
  undefined1 in_stack_fffffffffffff317;
  ElementsConfidentialAddress *in_stack_fffffffffffff318;
  undefined7 in_stack_fffffffffffff320;
  undefined1 in_stack_fffffffffffff327;
  AssertHelper local_c70;
  Message local_c68;
  undefined4 local_c5c;
  AssertionResult local_c58;
  AssertHelper local_c48;
  Message local_c40;
  undefined4 local_c34;
  AssertionResult local_c30;
  AssertHelper local_c20;
  Message local_c18;
  undefined4 local_c0c;
  size_type local_c08;
  AssertionResult local_c00;
  AssertHelper local_bf0;
  Message local_be8;
  undefined4 local_bdc;
  AssertionResult local_bd8;
  string local_bc8;
  AssertHelper local_ba8;
  Message local_ba0;
  undefined1 local_b91;
  AssertionResult local_b90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b80;
  allocator local_b61;
  string local_b60;
  ConfidentialAssetId local_b40;
  int64_t local_b18;
  undefined1 local_b10;
  int64_t local_b08;
  undefined1 local_b00;
  AssertHelper local_af8;
  Message local_af0;
  string local_ae8;
  AssertionResult local_ac8;
  AssertHelper local_ab8;
  Message local_ab0;
  undefined4 local_aa4;
  int64_t local_aa0;
  undefined1 local_a98;
  Amount local_a90;
  Address *local_a80;
  AssertionResult local_a78;
  ConfidentialAssetId local_a68;
  AssertHelper local_a40;
  Message local_a38;
  undefined4 local_a2c;
  AssertionResult local_a28;
  string local_a18;
  AssertHelper local_9f8;
  Message local_9f0;
  undefined1 local_9e1;
  AssertionResult local_9e0;
  AssertHelper local_9d0;
  Message local_9c8;
  undefined4 local_9c0;
  uint32_t local_9bc;
  AssertionResult local_9b8;
  AssertHelper local_9a8;
  Message local_9a0;
  undefined4 local_994;
  AssertionResult local_990;
  string local_980;
  AssertHelper local_960;
  Message local_958;
  Script local_950;
  undefined1 local_911;
  AssertionResult local_910;
  AssertHelper local_900;
  Message local_8f8;
  undefined4 local_8ec;
  AssertionResult local_8e8;
  string local_8d8;
  AssertHelper local_8b8;
  Message local_8b0;
  undefined1 local_8a1;
  AssertionResult local_8a0;
  AssertHelper local_890;
  Message local_888;
  undefined4 local_87c;
  AssertionResult local_878;
  string local_868;
  AssertHelper local_848;
  Message local_840;
  undefined1 local_831;
  AssertionResult local_830;
  undefined4 local_81c;
  AssertHelper local_818;
  Message local_810;
  string local_808;
  AssertionResult local_7e8;
  Address local_7d8;
  AssertHelper local_660;
  Message local_658;
  string local_650;
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  string local_610;
  AssertionResult local_5f0;
  allocator local_5d9;
  string local_5d8;
  ConfidentialAssetId local_5b8;
  int64_t local_590;
  undefined1 local_588;
  int64_t local_580;
  undefined1 local_578;
  allocator local_569;
  string local_568;
  ConfidentialAssetId local_548;
  int64_t local_520;
  undefined1 local_518;
  Amount local_510;
  allocator local_4f9;
  string local_4f8;
  Txid local_4d8;
  OutPoint local_4b8;
  allocator local_489;
  string local_488;
  Txid local_468;
  OutPoint local_448;
  Address local_420;
  allocator local_291;
  string local_290;
  ElementsConfidentialAddress local_270;
  ConfidentialTransaction local_c0 [3];
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffff2f8 >> 0x38);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             (uint32_t)((ulong)in_stack_fffffffffffff228 >> 0x20),
             (uint32_t)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             &local_291);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_270,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_420,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_488,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_489);
  cfd::core::Txid::Txid(&local_468,&local_488);
  cfd::core::OutPoint::OutPoint(&local_448,&local_468,2);
  cfd::core::Txid::~Txid((Txid *)0x215ac1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4f8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_4f9);
  cfd::core::Txid::Txid(&local_4d8,&local_4f8);
  cfd::core::OutPoint::OutPoint(&local_4b8,&local_4d8,0);
  cfd::ConfidentialTransactionContext::AddTxIn
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),in_stack_fffffffffffff268
            );
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x215b62);
  cfd::core::Txid::~Txid((Txid *)0x215b6f);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  cfd::ConfidentialTransactionContext::AddTxIn
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),in_stack_fffffffffffff268
            );
  AVar11 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_520 = AVar11.amount_;
  local_518 = AVar11.ignore_check_;
  local_510.amount_ = local_520;
  local_510.ignore_check_ = (bool)local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_568,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_569);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_548,&local_568);
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_c0,&local_510,&local_548);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x215c6d);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  AVar11 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_590 = AVar11.amount_;
  local_588 = AVar11.ignore_check_;
  local_580 = local_590;
  local_578 = local_588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_5d9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_5b8,&local_5d8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff327,in_stack_fffffffffffff320),in_stack_fffffffffffff318
             ,(Amount *)
              CONCAT17(in_stack_fffffffffffff317,
                       CONCAT16(in_stack_fffffffffffff316,
                                CONCAT15(in_stack_fffffffffffff315,in_stack_fffffffffffff310))),
             (ConfidentialAssetId *)in_stack_fffffffffffff308,
             SUB41(in_stack_fffffffffffff304 >> 0x18,0));
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x215d64);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_610,&local_c0[0].super_AbstractTransaction);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5f0,"txc.GetHex().c_str()",
             "\"020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000\""
             ,pcVar8,
             "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
            );
  std::__cxx11::string::~string((string *)&local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x2160aa);
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x61,pcVar8);
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::Message::~Message((Message *)0x21610d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216165);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_650,&local_420);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_630,"addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",pcVar8,"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz")
  ;
  std::__cxx11::string::~string((string *)&local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_630);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x216252);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x62,pcVar8);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message((Message *)0x2162b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21630d);
  cfd::ConfidentialTransactionContext::GetTxOutAddress
            (in_stack_fffffffffffff308,in_stack_fffffffffffff304,in_stack_fffffffffffff300,
             (bool)uVar2);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_808,&local_7d8);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7e8,"out1_addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",pcVar8,"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz")
  ;
  std::__cxx11::string::~string((string *)&local_808);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_7e8);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_810);
    in_stack_fffffffffffff318 =
         (ElementsConfidentialAddress *)
         testing::AssertionResult::failure_message((AssertionResult *)0x216437);
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x65,(char *)in_stack_fffffffffffff318);
    testing::internal::AssertHelper::operator=(&local_818,&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    testing::Message::~Message((Message *)0x21649a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2164f2);
  local_81c = 0;
  uVar3 = cfd::ConfidentialTransactionContext::IsFindTxIn
                    ((ConfidentialTransactionContext *)
                     CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                     in_stack_fffffffffffff290,in_stack_fffffffffffff288);
  local_831 = uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x21654c);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_830);
  if (!(bool)uVar4) {
    testing::Message::Message(&local_840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_868,(internal *)&local_830,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x68,pcVar8);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    std::__cxx11::string::~string((string *)&local_868);
    testing::Message::~Message((Message *)0x21664a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2166c2);
  local_87c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_878);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_888);
    in_stack_fffffffffffff308 =
         (ConfidentialTransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x216769);
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x69,(char *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    testing::Message::~Message((Message *)0x2167cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216824);
  local_8a1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        ((ConfidentialTransactionContext *)
                         CONCAT17(in_stack_fffffffffffff2bf,in_stack_fffffffffffff2b8),
                         in_stack_fffffffffffff2b0,
                         (uint32_t *)CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8),
                         in_stack_fffffffffffff2a0);
  remove_nonce = local_8a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x216877);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8d8,(internal *)&local_8a0,(AssertionResult *)"txc.IsFindTxOut(addr, &index)",
               "false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    testing::Message::~Message((Message *)0x216975);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2169ed);
  local_8ec = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x216a94);
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    testing::Message::~Message((Message *)0x216af7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216b4f);
  cfd::core::Script::Script(&local_950);
  local_911 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                         (uint32_t *)CONCAT17(in_stack_fffffffffffff2bf,in_stack_fffffffffffff2b8),
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff2b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x216bb1);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_980,(internal *)&local_910,
               (AssertionResult *)"txc.IsFindTxOut(Script(), &index)","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    std::__cxx11::string::~string((string *)&local_980);
    testing::Message::~Message((Message *)0x216ce2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216d5a);
  local_994 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x216e01);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    testing::Message::~Message((Message *)0x216e64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216ebc);
  uVar7 = cfd::ConfidentialTransactionContext::GetTxOutIndex
                    ((ConfidentialTransactionContext *)
                     CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                     in_stack_fffffffffffff278);
  local_9c0 = 1;
  local_9bc = uVar7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9b8);
  uVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff2e0);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    in_stack_fffffffffffff2d8 =
         (ConfidentialAssetId *)
         testing::AssertionResult::failure_message((AssertionResult *)0x216f8f);
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6e,(char *)in_stack_fffffffffffff2d8);
    testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    testing::Message::~Message((Message *)0x216ff2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217047);
  local_9e1 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut
                        ((ConfidentialTransactionContext *)CONCAT44(uVar7,uVar13),
                         (uint32_t *)in_stack_fffffffffffff2d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x21708e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a18,(internal *)&local_9e0,(AssertionResult *)"txc.IsFindFeeTxOut(&index)",
               "false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6f,pcVar8);
    testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    testing::Message::~Message((Message *)0x21718c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217204);
  local_a2c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x2172ab);
    testing::internal::AssertHelper::AssertHelper
              (&local_a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x70,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a40,&local_a38);
    testing::internal::AssertHelper::~AssertHelper(&local_a40);
    testing::Message::~Message((Message *)0x21730e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217366);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_a68);
  AVar11 = cfd::ConfidentialTransactionContext::GetFeeAmount
                     ((ConfidentialTransactionContext *)CONCAT44(uVar7,uVar13),
                      in_stack_fffffffffffff2d8);
  local_aa0 = AVar11.amount_;
  uVar10 = AVar11.ignore_check_;
  local_a98 = uVar10;
  local_a90.amount_ = local_aa0;
  local_a90.ignore_check_ = (bool)uVar10;
  address = (Address *)cfd::core::Amount::GetSatoshiValue(&local_a90);
  local_aa4 = 0x1c84;
  local_a80 = address;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (long *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  uVar6 = testing::AssertionResult::operator_cast_to_bool(&local_a78);
  if (!(bool)uVar6) {
    testing::Message::Message(&local_ab0);
    in_stack_fffffffffffff2a0 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x2174be);
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x72,(char *)in_stack_fffffffffffff2a0);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    testing::Message::~Message((Message *)0x21751b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217573);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_ae8,&local_a68);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ac8,"asset.GetHex().c_str()",
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",pcVar8,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::__cxx11::string::~string((string *)&local_ae8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ac8);
  if (!bVar1) {
    testing::Message::Message(&local_af0);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x21765a);
    testing::internal::AssertHelper::AssertHelper
              (&local_af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x73,pcVar8);
    testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
    testing::internal::AssertHelper::~AssertHelper(&local_af8);
    testing::Message::~Message((Message *)0x2176b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21770f);
  AVar11 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_b18 = AVar11.amount_;
  local_b10 = AVar11.ignore_check_;
  paVar12 = &local_b61;
  local_b08 = local_b18;
  local_b00 = local_b10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b60,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,paVar12);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_b40,&local_b60);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)CONCAT17(uVar2,in_stack_fffffffffffff320),
             in_stack_fffffffffffff318,
             (Amount *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,in_stack_fffffffffffff310))),
             (ConfidentialAssetId *)in_stack_fffffffffffff308,(bool)remove_nonce);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2177da);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x217806);
  local_b91 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        ((ConfidentialTransactionContext *)
                         CONCAT17(uVar10,in_stack_fffffffffffff2b8),address,
                         (uint32_t *)CONCAT17(uVar6,in_stack_fffffffffffff2a8),
                         in_stack_fffffffffffff2a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x217854);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bc8,(internal *)&local_b90,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index, &indexes)","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_ba8,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_ba8);
    std::__cxx11::string::~string((string *)&local_bc8);
    testing::Message::~Message((Message *)0x2179d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217a4c);
  local_bdc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bd8);
  if (!bVar1) {
    testing::Message::Message(&local_be8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x217aed);
    testing::internal::AssertHelper::AssertHelper
              (&local_bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_bf0,&local_be8);
    testing::internal::AssertHelper::~AssertHelper(&local_bf0);
    testing::Message::~Message((Message *)0x217b4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217b9f);
  local_c08 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b80);
  local_c0c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c00);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    in_stack_fffffffffffff248 =
         testing::AssertionResult::failure_message((AssertionResult *)0x217c55);
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7c,in_stack_fffffffffffff248);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    testing::Message::~Message((Message *)0x217cb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217d0a);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b80);
  if (sVar9 == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b80,0);
    local_c34 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff248,
               (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (uint *)in_stack_fffffffffffff238,
               (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
    in_stack_fffffffffffff247 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
    if (!(bool)in_stack_fffffffffffff247) {
      testing::Message::Message(&local_c40);
      in_stack_fffffffffffff238 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0x217dce);
      testing::internal::AssertHelper::AssertHelper
                (&local_c48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7e,(char *)in_stack_fffffffffffff238);
      testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
      testing::internal::AssertHelper::~AssertHelper(&local_c48);
      testing::Message::~Message((Message *)0x217e2b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x217e80);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b80,1);
    local_c5c = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff248,
               (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (uint *)in_stack_fffffffffffff238,
               (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
    in_stack_fffffffffffff237 = testing::AssertionResult::operator_cast_to_bool(&local_c58);
    if (!(bool)in_stack_fffffffffffff237) {
      testing::Message::Message(&local_c68);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x217f2e);
      testing::internal::AssertHelper::AssertHelper
                (&local_c70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7f,pcVar8);
      testing::internal::AssertHelper::operator=(&local_c70,&local_c68);
      testing::internal::AssertHelper::~AssertHelper(&local_c70);
      testing::Message::~Message((Message *)0x217f89);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x217fde);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x218009);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x218023);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}